

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileBlockManager::ReadBlocks
          (SingleFileBlockManager *this,FileBuffer *buffer,block_id_t start_block,idx_t block_count)

{
  data_ptr_t pdVar1;
  unsigned_long params_1;
  idx_t iVar2;
  type handle;
  idx_t iVar3;
  idx_t iVar4;
  idx_t size;
  uint64_t params;
  IOException *this_00;
  allocator local_61;
  optional_idx *local_60;
  idx_t local_58;
  string local_50;
  
  iVar2 = GetBlockLocation(this,start_block);
  handle = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator*
                     (&this->handle);
  local_58 = iVar2;
  FileBuffer::Read(buffer,handle,iVar2);
  pdVar1 = buffer->internal_buffer;
  local_60 = &(this->super_BlockManager).block_alloc_size;
  iVar2 = 0;
  while( true ) {
    if (block_count == iVar2) {
      return;
    }
    iVar3 = optional_idx::GetIndex(local_60);
    params_1 = *(unsigned_long *)(pdVar1 + iVar3 * iVar2);
    iVar4 = BlockManager::GetBlockHeaderSize(&this->super_BlockManager);
    size = BlockManager::GetBlockSize(&this->super_BlockManager);
    params = Checksum(pdVar1 + iVar4 + iVar3 * iVar2,size);
    if (params_1 != params) break;
    iVar2 = iVar2 + 1;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,
             "Corrupt database file: computed checksum %llu does not match stored checksum %llu in block at location %llu"
             ,&local_61);
  iVar3 = optional_idx::GetIndex(local_60);
  IOException::IOException<unsigned_long,unsigned_long,unsigned_long>
            (this_00,&local_50,params,params_1,iVar3 * iVar2 + local_58);
  __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SingleFileBlockManager::ReadBlocks(FileBuffer &buffer, block_id_t start_block, idx_t block_count) {
	D_ASSERT(start_block >= 0);
	D_ASSERT(block_count >= 1);

	// read the buffer from disk
	auto location = GetBlockLocation(start_block);
	buffer.Read(*handle, location);

	// for each of the blocks - verify the checksum
	auto ptr = buffer.InternalBuffer();
	for (idx_t i = 0; i < block_count; i++) {
		// compute the checksum
		auto start_ptr = ptr + i * GetBlockAllocSize();
		auto stored_checksum = Load<uint64_t>(start_ptr);
		uint64_t computed_checksum = Checksum(start_ptr + GetBlockHeaderSize(), GetBlockSize());
		// verify the checksum
		if (stored_checksum != computed_checksum) {
			throw IOException(
			    "Corrupt database file: computed checksum %llu does not match stored checksum %llu in block "
			    "at location %llu",
			    computed_checksum, stored_checksum, location + i * GetBlockAllocSize());
		}
	}
}